

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O1

void duckdb::ListFilterFunctor::AppendResult
               (Vector *result,Vector *lambda_vector,idx_t elem_cnt,list_entry_t *result_entries,
               ListFilterInfo *info,LambdaExecuteInfo *execute_info)

{
  idx_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  pointer puVar4;
  reference pvVar5;
  reference pvVar6;
  idx_t iVar7;
  size_type sVar8;
  ulong uVar9;
  idx_t iVar10;
  SelectionVector sel;
  UnifiedVectorFormat lambda_data;
  Vector result_lists;
  SelectionVector local_f8;
  long *local_e0;
  long local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  SelectionVector::SelectionVector(&local_f8,elem_cnt);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
  duckdb::Vector::ToUnifiedFormat((ulong)lambda_vector,(UnifiedVectorFormat *)elem_cnt);
  if (elem_cnt == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    iVar10 = 0;
    do {
      iVar7 = iVar10;
      if (*local_e0 != 0) {
        iVar7 = (idx_t)*(uint *)(*local_e0 + iVar10 * 4);
      }
      puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar8 = info->row_idx;
      while ((sVar8 < (ulong)((long)puVar4 -
                              (long)(info->entry_lengths).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) &&
             (pvVar5 = vector<unsigned_long,_true>::operator[](&info->entry_lengths,sVar8),
             *pvVar5 == 0))) {
        iVar1 = info->row_idx;
        result_entries[iVar1].offset = info->offset;
        result_entries[iVar1].length = 0;
        sVar8 = iVar1 + 1;
        info->row_idx = sVar8;
        puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      if (((local_d0 == 0) || ((*(ulong *)(local_d0 + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0)
          ) && (*(char *)(local_d8 + iVar7) == '\x01')) {
        local_f8.sel_vector[uVar9] = (sel_t)iVar10;
        uVar9 = uVar9 + 1;
        info->length = info->length + 1;
      }
      info->src_length = info->src_length + 1;
      pvVar5 = vector<unsigned_long,_true>::operator[](&info->entry_lengths,info->row_idx);
      if (*pvVar5 == info->src_length) {
        uVar2 = info->offset;
        iVar7 = info->row_idx;
        result_entries[iVar7].offset = uVar2;
        uVar3 = info->length;
        result_entries[iVar7].length = uVar3;
        info->offset = uVar3 + uVar2;
        info->row_idx = iVar7 + 1;
        info->length = 0;
        info->src_length = 0;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != elem_cnt);
  }
  puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar8 = info->row_idx;
  while ((sVar8 < (ulong)((long)puVar4 -
                          (long)(info->entry_lengths).
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) &&
         (pvVar5 = vector<unsigned_long,_true>::operator[](&info->entry_lengths,sVar8), *pvVar5 == 0
         ))) {
    iVar10 = info->row_idx;
    result_entries[iVar10].offset = info->offset;
    result_entries[iVar10].length = 0;
    sVar8 = iVar10 + 1;
    info->row_idx = sVar8;
    puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pvVar6 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)&execute_info->input_chunk,
                      (ulong)execute_info->has_index);
  duckdb::Vector::Vector(local_98,pvVar6,&local_f8,uVar9);
  duckdb::ListVector::Append(result,local_98,uVar9,0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (local_f8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void AppendResult(Vector &result, Vector &lambda_vector, const idx_t elem_cnt, list_entry_t *result_entries,
	                         ListFilterInfo &info, LambdaExecuteInfo &execute_info) {

		idx_t count = 0;
		SelectionVector sel(elem_cnt);
		UnifiedVectorFormat lambda_data;
		lambda_vector.ToUnifiedFormat(elem_cnt, lambda_data);

		auto lambda_values = UnifiedVectorFormat::GetData<bool>(lambda_data);
		auto &lambda_validity = lambda_data.validity;

		// compute the new lengths and offsets, and create a selection vector
		for (idx_t i = 0; i < elem_cnt; i++) {
			auto entry_idx = lambda_data.sel->get_index(i);

			// set length and offset of empty lists
			while (info.row_idx < info.entry_lengths.size() && !info.entry_lengths[info.row_idx]) {
				result_entries[info.row_idx].offset = info.offset;
				result_entries[info.row_idx].length = 0;
				info.row_idx++;
			}

			// found a true value
			if (lambda_validity.RowIsValid(entry_idx) && lambda_values[entry_idx]) {
				sel.set_index(count++, i);
				info.length++;
			}

			info.src_length++;

			// we traversed the entire source list
			if (info.entry_lengths[info.row_idx] == info.src_length) {
				// set the offset and length of the result entry
				result_entries[info.row_idx].offset = info.offset;
				result_entries[info.row_idx].length = info.length;

				// reset all other fields
				info.offset += info.length;
				info.row_idx++;
				info.length = 0;
				info.src_length = 0;
			}
		}

		// set length and offset of all remaining empty lists
		while (info.row_idx < info.entry_lengths.size() && !info.entry_lengths[info.row_idx]) {
			result_entries[info.row_idx].offset = info.offset;
			result_entries[info.row_idx].length = 0;
			info.row_idx++;
		}

		// slice the input chunk's corresponding vector to get the new lists
		// and append them to the result
		idx_t source_list_idx = execute_info.has_index ? 1 : 0;
		Vector result_lists(execute_info.input_chunk.data[source_list_idx], sel, count);
		ListVector::Append(result, result_lists, count, 0);
	}